

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consoleOutput.cpp
# Opt level: O1

outputArrow * __thiscall
consoleOutput::initArrow(consoleOutput *this,int8_t nodeIndex,int8_t arrowIndex)

{
  WINDOW *pWVar1;
  pointer pcVar2;
  outputArrow *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int arrowIndex_00;
  int iVar4;
  undefined7 in_register_00000031;
  _Alloc_hider _Var5;
  int iVar6;
  int iVar7;
  arrowType *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar4 = (int)CONCAT71(in_register_00000031,nodeIndex);
  pWVar1 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar4].w_main;
  iVar7 = -1;
  iVar6 = -1;
  if (pWVar1 != (WINDOW *)0x0) {
    iVar6 = (int)pWVar1->_begy;
    iVar7 = (int)pWVar1->_begx;
  }
  arrowIndex_00 = (int)arrowIndex;
  this_00 = (outputArrow *)operator_new(0x20);
  if (arrowIndex_00 == 2) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    pcVar2 = (this->super_output).lbl._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + (this->super_output).lbl._M_string_length);
    outputArrow::outputArrow(this_00,nodeIndex,iVar6 + 0xb,iVar7 + 7,2,&local_90);
    (this->super_output).outArr = this_00;
    paVar3 = &local_90.field_2;
    _Var5._M_p = local_90._M_dataplus._M_p;
  }
  else if (arrowIndex_00 == 1) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar2 = (this->super_output).lbl._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (this->super_output).lbl._M_string_length);
    outputArrow::outputArrow(this_00,nodeIndex,iVar6 + 3,iVar7 + 0x1b,1,&local_70);
    (this->super_output).outArr = this_00;
    paVar3 = &local_70.field_2;
    _Var5._M_p = local_70._M_dataplus._M_p;
  }
  else if (arrowIndex == '\0') {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar2 = (this->super_output).lbl._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (this->super_output).lbl._M_string_length);
    outputArrow::outputArrow(this_00,nodeIndex,iVar6 + -1,iVar7 + 7,0,&local_50);
    (this->super_output).outArr = this_00;
    paVar3 = &local_50.field_2;
    _Var5._M_p = local_50._M_dataplus._M_p;
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    pcVar2 = (this->super_output).lbl._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + (this->super_output).lbl._M_string_length);
    outputArrow::outputArrow(this_00,nodeIndex,iVar6 + 3,iVar7 + -4,arrowIndex_00,&local_b0);
    (this->super_output).outArr = this_00;
    paVar3 = &local_b0.field_2;
    _Var5._M_p = local_b0._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar3) {
    operator_delete(_Var5._M_p,paVar3->_M_allocated_capacity + 1);
  }
  local_b8 = &((this->super_output).outArr)->super_arrowType;
  if (gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<arrowType*,std::allocator<arrowType*>>::_M_realloc_insert<arrowType*>
              ((vector<arrowType*,std::allocator<arrowType*>> *)&gridArrows,
               (iterator)
               gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_b8);
  }
  else {
    *gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
     super__Vector_impl_data._M_finish = local_b8;
    gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data._M_start
  [iVar4].arrows[arrowIndex] = &((this->super_output).outArr)->super_arrowType;
  wrefresh((((this->super_output).outArr)->super_arrowType).win);
  return (this->super_output).outArr;
}

Assistant:

outputArrow *consoleOutput::initArrow(int8_t nodeIndex, int8_t arrowIndex) {
	int y, x;
	getbegyx(grid[nodeIndex].w_main, y, x);

	if (arrowIndex == 0)
		outArr = new outputArrow(nodeIndex, y - ARROW_V_HEIGHT, x + floor(NODE_WIDTH / 2) - floor(ARROW_V_WIDTH / 2), arrowIndex, lbl);
	else if (arrowIndex == 1)
		outArr = new outputArrow(nodeIndex, y + floor(NODE_HEIGHT / 2) - floor(ARROW_H_HEIGHT / 2), x + NODE_WIDTH + GAP_WIDTH_H, arrowIndex, lbl);
	else if (arrowIndex == 2)
		outArr = new outputArrow(nodeIndex, y + NODE_HEIGHT + GAP_WIDTH_V, x + floor(NODE_WIDTH / 2) - floor(ARROW_V_WIDTH / 2), arrowIndex, lbl);
	else
		outArr = new outputArrow(nodeIndex, y + floor(NODE_HEIGHT / 2) - floor(ARROW_H_HEIGHT / 2), x - ARROW_H_WIDTH, arrowIndex, lbl);

	gridArrows.push_back(outArr);
	grid[nodeIndex].arrows[arrowIndex] = outArr;

	wrefresh(outArr->win);

	return outArr;
}